

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_visitor.cpp
# Opt level: O3

void __thiscall interpreter_visitor::visit(interpreter_visitor *this,ArrayType *ptr)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)(ptr->super_Type).name);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)(ptr->super_Type).name);
    if (iVar1 != 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "ploxo";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
  }
  this->is_array = true;
  return;
}

Assistant:

void interpreter_visitor::visit(ArrayType* ptr) {
    if (*ptr->name != "int" && *ptr->name != "bool")   
        throw "ploxo";
    is_array = true;
    //name
}